

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# standard_buffer_manager.cpp
# Opt level: O2

shared_ptr<duckdb::BlockHandle,_true> __thiscall
duckdb::StandardBufferManager::RegisterMemory
          (StandardBufferManager *this,MemoryTag tag,idx_t block_size,idx_t block_header_size,
          bool can_destroy)

{
  atomic<long> *paVar1;
  long lVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> args_1;
  StandardBufferManager *pSVar3;
  type args_1_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var4;
  undefined7 in_register_00000031;
  StandardBufferManager *this_00;
  undefined7 in_register_00000081;
  StringUtil *this_01;
  shared_ptr<duckdb::BlockHandle,_true> sVar5;
  undefined1 auStack_a8 [14];
  DestroyBufferUpon destroy_buffer_upon;
  MemoryTag tag_local;
  _Head_base<0UL,_duckdb::FileBuffer_*,_false> local_98;
  long *local_90 [2];
  StandardBufferManager *local_80;
  idx_t alloc_size;
  idx_t local_70;
  TempBufferPoolReservation res;
  string local_50;
  
  this_00 = (StandardBufferManager *)CONCAT71(in_register_00000031,tag);
  this_01 = (StringUtil *)
            (block_header_size + CONCAT71(in_register_00000081,can_destroy) + 0xfff &
            0xfffffffffffff000);
  local_98._M_head_impl = (FileBuffer *)0x0;
  tag_local = (MemoryTag)block_size;
  local_80 = this;
  alloc_size = (idx_t)this_01;
  StringUtil::BytesToHumanReadableString_abi_cxx11_(&local_50,this_01,0x400,block_header_size);
  args_1._M_string_length = 0x1acfc1f;
  args_1._M_dataplus._M_p = (pointer)&local_50;
  args_1.field_2._0_14_ = auStack_a8;
  args_1.field_2._M_local_buf[0xe] = destroy_buffer_upon;
  args_1.field_2._M_local_buf[0xf] = tag_local;
  EvictBlocksOrThrow<char_const*,std::__cxx11::string>
            (&res,this_00,(MemoryTag)block_size,(idx_t)this_01,
             (unique_ptr<duckdb::FileBuffer,_std::default_delete<duckdb::FileBuffer>,_true> *)
             &local_98,"could not allocate block of size %s%s",args_1);
  ::std::__cxx11::string::~string((string *)&local_50);
  (*(this_00->super_BufferManager)._vptr_BufferManager[0x1e])
            (local_90,this_00,block_header_size,CONCAT71(in_register_00000081,can_destroy),&local_98
             ,2);
  args_1_00 = unique_ptr<duckdb::BlockManager,_std::default_delete<duckdb::BlockManager>,_true>::
              operator*(&this_00->temp_block_manager);
  pSVar3 = local_80;
  LOCK();
  paVar1 = &this_00->temporary_id;
  lVar2 = (paVar1->super___atomic_base<long>)._M_i;
  (paVar1->super___atomic_base<long>)._M_i = (paVar1->super___atomic_base<long>)._M_i + 1;
  UNLOCK();
  local_70 = lVar2 + 1;
  make_shared_ptr<duckdb::BlockHandle,duckdb::BlockManager&,long,duckdb::MemoryTag&,duckdb::unique_ptr<duckdb::FileBuffer,std::default_delete<duckdb::FileBuffer>,true>,duckdb::DestroyBufferUpon&,unsigned_long&,duckdb::TempBufferPoolReservation>
            ((BlockManager *)local_80,(long *)args_1_00,(MemoryTag *)&local_70,
             (unique_ptr<duckdb::FileBuffer,_std::default_delete<duckdb::FileBuffer>,_true> *)
             &tag_local,(DestroyBufferUpon *)local_90,(unsigned_long *)&destroy_buffer_upon,
             (TempBufferPoolReservation *)&alloc_size);
  if (local_90[0] != (long *)0x0) {
    (**(code **)(*local_90[0] + 8))();
  }
  TempBufferPoolReservation::~TempBufferPoolReservation(&res);
  _Var4._M_pi = extraout_RDX;
  if (local_98._M_head_impl != (FileBuffer *)0x0) {
    (*(local_98._M_head_impl)->_vptr_FileBuffer[1])();
    _Var4._M_pi = extraout_RDX_00;
  }
  sVar5.internal.super___shared_ptr<duckdb::BlockHandle,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = _Var4._M_pi;
  sVar5.internal.super___shared_ptr<duckdb::BlockHandle,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)pSVar3;
  return (shared_ptr<duckdb::BlockHandle,_true>)
         sVar5.internal.super___shared_ptr<duckdb::BlockHandle,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

shared_ptr<BlockHandle> StandardBufferManager::RegisterMemory(MemoryTag tag, idx_t block_size, idx_t block_header_size,
                                                              bool can_destroy) {
	auto alloc_size = GetAllocSize(block_size + block_header_size);

	// Evict blocks until there is enough memory to store the buffer.
	unique_ptr<FileBuffer> reusable_buffer;
	auto res = EvictBlocksOrThrow(tag, alloc_size, &reusable_buffer, "could not allocate block of size %s%s",
	                              StringUtil::BytesToHumanReadableString(alloc_size));

	// Create a new buffer and a block to hold the buffer.
	auto buffer = ConstructManagedBuffer(block_size, block_header_size, std::move(reusable_buffer),
	                                     FileBufferType::MANAGED_BUFFER);
	DestroyBufferUpon destroy_buffer_upon = can_destroy ? DestroyBufferUpon::EVICTION : DestroyBufferUpon::BLOCK;
	return make_shared_ptr<BlockHandle>(*temp_block_manager, ++temporary_id, tag, std::move(buffer),
	                                    destroy_buffer_upon, alloc_size, std::move(res));
}